

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radial_transform.hpp
# Opt level: O2

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::
quadrature_traits<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_void>
::generate(tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,MuraKnowlesRadialTraits *traits)

{
  double x;
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  double dVar4;
  weight_container weights;
  point_container points;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_70;
  _Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  local_58;
  size_type __n;
  
  iVar2 = (*(traits->super_RadialTraits)._vptr_RadialTraits[3])(traits);
  __n = CONCAT44(extraout_var,iVar2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_70,__n,(allocator_type *)&local_58);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,__n,(allocator_type *)&local_58);
  quadrature_traits<IntegratorXX::UniformTrapezoid<double,_double>,_void>::generate
            ((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&local_58,__n + 2);
  for (sVar3 = 0; __n != sVar3; sVar3 = sVar3 + 1) {
    x = local_58.super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>.
        _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar3 + 1];
    dVar1 = local_58.super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
            super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar3 + 1];
    dVar4 = MuraKnowlesRadialTraits::radial_transform<double>(traits,x);
    local_70._M_impl.super__Vector_impl_data._M_start[sVar3] = dVar4;
    local_88._M_impl.super__Vector_impl_data._M_start[sVar3] =
         ((traits->R_ * 3.0 * x * x) / (1.0 - x * x * x)) * dVar1;
  }
  std::
  _Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_70,
             (vector<double,_std::allocator<double>_> *)&local_88);
  std::
  _Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl(&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( const RadialTraitsType& traits ) {

    using base_quad_traits = quadrature_traits<BaseQuad>;

    const auto npts = traits.npts();
    point_container  points( npts );
    weight_container weights( npts );


    const auto npts_base = base_quad_traits::bound_inclusive ? npts+2 : npts;
    auto [base_x, base_w] = base_quad_traits::generate(npts_base);

    const auto ipts_offset = !!base_quad_traits::bound_inclusive;
    for(size_t i = 0; i < npts; ++i) {
      const auto xi = base_x[i + ipts_offset];
      const auto wi = base_w[i + ipts_offset];
      points[i]  = traits.radial_transform(xi);
      weights[i] = wi * traits.radial_jacobian(xi);
    }

    return std::make_tuple(points, weights);
  }